

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O2

void ParseLFP(EeePLFPDataBlock_t *dblock,int size)

{
  ulong uVar1;
  ulong uVar2;
  
  printf("   LFP block:\n      Interface: %d\n",(ulong)dblock->Interface);
  printf("      Raw Data:\n      ");
  uVar1 = (ulong)(size - 4U);
  if ((int)(size - 4U) < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if ((uVar2 & 0xf) == 0) {
      printf("\n      ");
    }
    printf("%02X ",(ulong)dblock->RawData[uVar2]);
  }
  putchar(10);
  return;
}

Assistant:

void ParseLFP(EeePLFPDataBlock_t *dblock, int size)
{
	int raw_size = size - FIELD_OFFSET(EeePLFPDataBlock_t, RawData);
	printf("   LFP block:\n      Interface: %d\n", dblock->Interface);
	printf("      Raw Data:\n      ");
	for( int i = 0; i < raw_size; i++ ) {
		if( i%16 == 0) {
			printf("\n      ");
		}
		printf("%02X ", dblock->RawData[i]);
	}
	printf("\n");
}